

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_WriteSharedArrayBuffer(BCWriterState *s,JSValue obj)

{
  uint8_t *puVar1;
  int iVar2;
  JSContext *in_RSI;
  void **in_RDI;
  JSArrayBuffer *abuf;
  JSObject *p;
  undefined4 in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  BCWriterState *s_00;
  JSContext *ctx;
  int local_4;
  
  s_00 = *(BCWriterState **)&in_RSI->binary_object_count;
  ctx = in_RSI;
  bc_put_u8(s_00,(uint8_t)(in_stack_ffffffffffffffcc >> 0x18));
  iVar2 = (int)((ulong)in_RSI >> 0x20);
  bc_put_leb128(s_00,in_stack_ffffffffffffffcc);
  bc_put_u64(s_00,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  iVar2 = js_resize_array(ctx,in_RDI,iVar2,(int *)s_00,in_stack_ffffffffffffffcc);
  if (iVar2 == 0) {
    puVar1 = (s_00->dbuf).buf;
    iVar2 = *(int *)(in_RDI + 0xd);
    *(int *)(in_RDI + 0xd) = iVar2 + 1;
    *(uint8_t **)((long)in_RDI[0xc] + (long)iVar2 * 8) = puVar1;
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int JS_WriteSharedArrayBuffer(BCWriterState *s, JSValueConst obj)
{
    JSObject *p = JS_VALUE_GET_OBJ(obj);
    JSArrayBuffer *abuf = p->u.array_buffer;
    assert(!abuf->detached); /* SharedArrayBuffer are never detached */
    bc_put_u8(s, BC_TAG_SHARED_ARRAY_BUFFER);
    bc_put_leb128(s, abuf->byte_length);
    bc_put_u64(s, (uintptr_t)abuf->data);
    if (js_resize_array(s->ctx, (void **)&s->sab_tab, sizeof(s->sab_tab[0]),
                        &s->sab_tab_size, s->sab_tab_len + 1))
        return -1;
    /* keep the SAB pointer so that the user can clone it or free it */
    s->sab_tab[s->sab_tab_len++] = abuf->data;
    return 0;
}